

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::load_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  size_t size_00;
  uchar *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long size;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  std::__cxx11::string::c_str();
  size_00 = lodepng_filesize((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if ((long)size_00 < 0) {
    local_4 = 0x4e;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_RDI,(size_type)in_RSI);
    if (size_00 == 0) {
      local_4 = 0;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDI,0);
      std::__cxx11::string::c_str();
      local_4 = lodepng_buffer_file(in_RSI,size_00,
                                    (char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                     in_stack_ffffffffffffffd8));
    }
  }
  return local_4;
}

Assistant:

unsigned load_file(std::vector<unsigned char>& buffer, const std::string& filename) {
  long size = lodepng_filesize(filename.c_str());
  if(size < 0) return 78;
  buffer.resize((size_t)size);
  return size == 0 ? 0 : lodepng_buffer_file(&buffer[0], (size_t)size, filename.c_str());
}